

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_opc_special3(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *s;
  ulong uVar1;
  TCGContext_conflict6 *tcg_ctx;
  uint uVar2;
  byte bVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  uint uVar6;
  uintptr_t o;
  TCGv_i64 pTVar7;
  TCGArg idx;
  uintptr_t o_2;
  uintptr_t o_5;
  uint uVar8;
  TCGOpcode TVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  DisasContext_conflict6 *ctx_00;
  MemOp_conflict2 memop;
  uint rd;
  uint op;
  uint base;
  int iVar12;
  uintptr_t o_6;
  uint uVar13;
  uintptr_t o_1;
  TCGv_i64 pTVar14;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  uVar13 = (uint)(env->active_tc).gpr[7];
  base = uVar13 >> 0x15 & 0x1f;
  op = uVar13 >> 0x10 & 0x1f;
  rd = uVar13 >> 0xb & 0x1f;
  uVar8 = uVar13 & 0xfc00003f;
  if (*(char *)((long)(env->active_tc).gpr + 0x91) == '\x01') {
    if (uVar8 + 0x84000000 < 0x3c) {
      iVar12 = (int)(short)uVar13 >> 7;
      switch(uVar8) {
      case 0x7c000000:
      case 0x7c000004:
        goto switchD_009af569_caseD_7c000000;
      case 0x7c000001:
      case 0x7c000002:
      case 0x7c000003:
      case 0x7c000005:
      case 0x7c000006:
      case 0x7c000007:
        goto switchD_009af569_caseD_7c000001;
      case 0x7c000008:
        goto switchD_009af569_caseD_7c000008;
      case 0x7c000009:
        goto switchD_009af569_caseD_7c000009;
      case 0x7c000019:
      case 0x7c00001a:
        if ((*(byte *)((long)(env->active_tc).gpr + 0x41) & 0x20) != 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        }
      case 0x7c000028:
      case 0x7c000029:
      case 0x7c00002c:
      case 0x7c00002d:
      case 0x7c00002e:
      case 0x7c00002f:
        if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
        }
        gen_ld((DisasContext_conflict6 *)env,uVar8,op,base,iVar12);
        return;
      case 0x7c00001b:
        if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
        }
        if ((*(byte *)((long)(env->active_tc).gpr + 99) & 8) == 0) {
          return;
        }
        gen_cache_operation((DisasContext_conflict6 *)env,op,base,(int16_t)iVar12);
        return;
      case 0x7c00001e:
        if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
        }
        gen_st_cond((DisasContext_conflict6 *)env,op,base,iVar12,MO_LESL,true);
        return;
      case 0x7c000020:
        goto switchD_009af569_caseD_7c000020;
      case 0x7c000021:
      case 0x7c000022:
        if ((*(byte *)((long)(env->active_tc).gpr + 0x41) & 0x20) != 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        }
      case 0x7c00001c:
      case 0x7c00001d:
      case 0x7c00001f:
        if (((env->active_tc).gpr[0xc] & 0x10) == 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x13,0);
        }
        gen_st((DisasContext_conflict6 *)env,uVar8,op,base,iVar12);
        return;
      case 0x7c000023:
        if (((env->active_tc).gpr[0xc] & 0x10) != 0) {
          return;
        }
        iVar12 = 0x13;
        goto LAB_009b024c;
      case 0x7c000024:
switchD_009af569_caseD_7c000024:
        uVar13 = (uVar13 & 0xfc0007ff) + 0x83ffffdc;
        uVar13 = uVar13 * 0x4000000 | uVar13 >> 6;
        if ((7 < uVar13 - 8) && (uVar13 != 0)) {
          if ((*(byte *)((long)(env->active_tc).gpr + 0x41) & 1) == 0) {
            generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
          }
          if (((env->active_tc).gpr[0xc] & 8) == 0) {
            generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
          }
          uVar10 = (uint)(env->active_tc).gpr[7] & 0xfc0007ff;
          goto LAB_009afa30;
        }
        goto LAB_009af78f;
      case 0x7c00003b:
switchD_009af569_caseD_7c00003b:
        gen_rdhwr((DisasContext_conflict6 *)env,op,rd,uVar13 >> 6 & 7);
        return;
      }
    }
  }
  else if ((int)uVar8 < 0x7c000020) {
    switch(uVar8) {
    case 0x7c000000:
    case 0x7c000004:
switchD_009af569_caseD_7c000000:
      bVar3 = (byte)(env->active_tc).gpr[8] & 0x40;
joined_r0x009af5dd:
      if (bVar3 == 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      gen_bitops((DisasContext_conflict6 *)env,uVar8,op,base,uVar13 >> 6 & 0x1f,rd);
      return;
    case 0x7c000001:
    case 0x7c000002:
    case 0x7c000003:
    case 0x7c000005:
    case 0x7c000006:
    case 0x7c000007:
switchD_009af569_caseD_7c000001:
      if ((*(byte *)((long)(env->active_tc).gpr + 0x41) & 1) == 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      bVar3 = (byte)(env->active_tc).gpr[0xc] & 8;
      goto joined_r0x009af5dd;
    case 0x7c000008:
switchD_009af569_caseD_7c000008:
      if (((env->active_tc).gpr[10] & 4) == 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      if (op == 0) {
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
      }
      else if (s->cpu_gpr[op] != (TCGv_i64)((long)pTVar4 - (long)s)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)pTVar4,
                   (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[op]));
      }
      if (base == 0) {
        TVar9 = INDEX_op_movi_i64;
        pTVar14 = (TCGv_i64)0x0;
LAB_009af926:
        tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar5,(TCGArg)pTVar14);
      }
      else if (s->cpu_gpr[base] != (TCGv_i64)((long)pTVar5 - (long)s)) {
        pTVar14 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[base]);
        TVar9 = INDEX_op_mov_i64;
        goto LAB_009af926;
      }
      pTVar4 = (TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s) + (long)s);
      pTVar5 = (TCGTemp *)((TCGv_i64)((long)pTVar5 - (long)s) + (long)s);
      local_48 = pTVar4;
      local_40 = pTVar5;
      tcg_gen_callN_mips64el(s,helper_fork_mips64el,(TCGTemp *)0x0,2,&local_48);
      tcg_temp_free_internal_mips64el(s,pTVar4);
      goto LAB_009af96a;
    case 0x7c000009:
switchD_009af569_caseD_7c000009:
      if (((env->active_tc).gpr[10] & 4) == 0) {
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar14 = (TCGv_i64)((long)pTVar4 - (long)s);
      if (base == 0) {
        TVar9 = INDEX_op_movi_i64;
        pTVar7 = (TCGv_i64)0x0;
LAB_009af87d:
        tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar4,(TCGArg)pTVar7);
      }
      else if (s->cpu_gpr[base] != pTVar14) {
        pTVar7 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[base]);
        TVar9 = INDEX_op_mov_i64;
        goto LAB_009af87d;
      }
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      pTVar5 = (TCGTemp *)((long)s + (long)pTVar14);
      local_40 = pTVar5;
      tcg_gen_callN_mips64el(s,helper_yield_mips64el,pTVar5,2,&local_48);
      if ((rd != 0) && (s->cpu_gpr[rd] != pTVar14)) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[rd]),
                   (TCGArg)pTVar4);
      }
      goto LAB_009af96a;
    }
  }
  else {
    if (uVar8 == 0x7c000020) {
switchD_009af569_caseD_7c000020:
      uVar10 = uVar13 & 0xfc0007ff;
      uVar13 = (uVar10 + 0x83ffffe0) * 0x4000000 | uVar10 + 0x83ffffe0 >> 6;
      if ((3 < uVar13 - 8) && (uVar13 != 0)) {
        if (((env->active_tc).gpr[8] & 0x40) == 0) {
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        }
LAB_009afa30:
        gen_bshfl((DisasContext_conflict6 *)env,uVar10,op,rd);
        return;
      }
LAB_009af78f:
      if ((*(byte *)((long)(env->active_tc).gpr + 0x41) & 0x20) == 0) {
        ctx = (DisasContext_conflict6 *)0x14;
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      goto LAB_009af824;
    }
    if (uVar8 == 0x7c000024) goto switchD_009af569_caseD_7c000024;
    if (uVar8 == 0x7c00003b) goto switchD_009af569_caseD_7c00003b;
  }
  uVar1 = (env->active_tc).gpr[8];
  if (((uint)uVar1 >> 0xd & 1) != 0) {
LAB_009af824:
    decode_opc_special3_r6(env,ctx);
    return;
  }
  uVar6 = rd;
  switch(uVar8) {
  case 0x7c00000a:
    uVar13 = (uVar13 & 0xfc0007ff) + 0x83fffff6;
    uVar13 = uVar13 * 0x2000000 | uVar13 >> 7;
    if ((uVar13 < 5) && (uVar13 != 1)) {
      if ((*(byte *)((long)(env->active_tc).gpr + 0x62) & 8) == 0) {
        decode_opc_special3_cold_1();
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar14 = (TCGv_i64)((long)pTVar4 - (long)s);
      if (base == 0) {
        if (op != 0) {
          pTVar7 = s->cpu_gpr[op];
          goto LAB_009b0003;
        }
        TVar9 = INDEX_op_movi_i64;
        pTVar7 = (TCGv_i64)0x0;
LAB_009b016f:
        tcg_gen_op2_mips64el(s,TVar9,(TCGArg)pTVar4,(TCGArg)pTVar7);
      }
      else {
        pTVar7 = s->cpu_gpr[base];
        if (op == 0) {
LAB_009b0003:
          if (pTVar7 != pTVar14) {
            pTVar7 = pTVar7 + (long)s;
            TVar9 = INDEX_op_mov_i64;
            goto LAB_009b016f;
          }
        }
        else {
          tcg_ctx = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
          tcg_gen_op3_mips64el
                    (tcg_ctx,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx + (long)pTVar14),
                     (TCGArg)(pTVar7 + (long)tcg_ctx),
                     (TCGArg)((long)&tcg_ctx->pool_cur + (long)s->cpu_gpr[op]));
          if ((*(byte *)((long)(env->active_tc).gpr + 0x61) & 2) != 0) {
            tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar14,pTVar14);
          }
        }
      }
      switch(uVar13) {
      case 0:
        idx = (TCGArg)(int)(env->active_tc).gpr[0xb];
        memop = MO_LESL;
        break;
      default:
        goto switchD_009b0192_caseD_1;
      case 2:
        idx = (TCGArg)(int)(env->active_tc).gpr[0xb];
        memop = MO_LESW;
        break;
      case 3:
        idx = (TCGArg)(int)(env->active_tc).gpr[0xb];
        memop = MO_8;
        break;
      case 4:
        idx = (TCGArg)(int)(env->active_tc).gpr[0xb];
        memop = MO_64;
      }
      tcg_gen_qemu_ld_i64_mips64el(s,pTVar14,pTVar14,idx,memop);
      if ((rd != 0) && (s->cpu_gpr[rd] != pTVar14)) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)pTVar4);
      }
switchD_009b0192_caseD_1:
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar14 + (long)s));
      return;
    }
    break;
  case 0x7c00000c:
    if ((uVar13 & 0xfc0007ff) == 0x7c00000c) {
      check_dsp((DisasContext_conflict6 *)env);
      if (op == 0) {
        return;
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      gen_load_gpr(s,(TCGv_i64)((long)pTVar4 - (long)s),op);
      gen_load_gpr(s,(TCGv_i64)((long)pTVar5 - (long)s),base);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      local_40 = pTVar5;
      local_38 = pTVar4;
      tcg_gen_callN_mips64el
                (s,helper_insv_mips64el,(TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[op]),3,
                 &local_48);
      tcg_temp_free_internal_mips64el(s,pTVar4);
LAB_009af96a:
      tcg_temp_free_internal_mips64el(s,pTVar5);
      return;
    }
    break;
  case 0x7c00000d:
    if ((uVar13 & 0xfc0007ff) == 0x7c00000d) {
      if (op == 0) {
        return;
      }
      check_dsp((DisasContext_conflict6 *)env);
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      gen_load_gpr(s,(TCGv_i64)((long)pTVar4 - (long)s),op);
      gen_load_gpr(s,(TCGv_i64)((long)pTVar5 - (long)s),base);
      local_48 = (TCGTemp *)(s->cpu_env + (long)s);
      local_40 = pTVar5;
      local_38 = pTVar4;
      tcg_gen_callN_mips64el
                (s,helper_dinsv_mips64el,(TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[op]),3,
                 &local_48);
      tcg_temp_free_internal_mips64el(s,pTVar4);
      goto LAB_009af96a;
    }
    break;
  case 0x7c000010:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar13 = uVar10 + 0x83fffff0 >> 6;
    if (((uVar10 + 0x83fffff0) * 0x4000000 | uVar13) < 0x20) {
      if ((0xd7ff33U >> (uVar13 & 0x1f) & 1) != 0) {
        uVar11 = 0x7c000010;
        goto LAB_009b00ca;
      }
      if ((0xf00000c0U >> (uVar13 & 0x1f) & 1) != 0) {
        iVar12 = 1;
        uVar11 = 0x7c000010;
        goto LAB_009b00fa;
      }
    }
    break;
  case 0x7c000011:
    uVar10 = uVar13 & 0xfc0007ff;
    switch((uVar10 + 0x83ffffef) * 0x4000000 | uVar10 + 0x83ffffef >> 6) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
      iVar12 = 0;
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 0xb:
    case 0xe:
    case 0x18:
    case 0x19:
    case 0x1a:
      iVar12 = 1;
      break;
    default:
      goto switchD_009af7d4_caseD_7c00000b;
    case 0xc:
    case 0xd:
    case 0xf:
    case 0x14:
    case 0x15:
      uVar11 = 0x7c000011;
      goto LAB_009b00ca;
    case 0x1e:
    case 0x1f:
      uVar11 = 0x7c000011;
LAB_009b0283:
      uVar10 = uVar13 & 0xfc0007ff;
      uVar6 = op;
      op = rd;
LAB_009b00ca:
      gen_mipsdsp_arith((DisasContext_conflict6 *)env,uVar11,uVar10,uVar6,base,op);
      return;
    }
    uVar10 = 0x7c000011;
LAB_009b0077:
    gen_mipsdsp_add_cmp_pick
              ((DisasContext_conflict6 *)env,uVar10,uVar13 & 0xfc0007ff,rd,base,op,iVar12);
    return;
  case 0x7c000012:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar8 = uVar10 + 0x83ffffae >> 6;
    if (((uVar10 + 0x83ffffae) * 0x4000000 | uVar8) < 0x1f) {
      if ((0x78011979U >> (uVar8 & 0x1f) & 1) != 0) {
        uVar11 = 0x7c000012;
        goto LAB_009b00ca;
      }
      if ((0x4000606U >> (uVar8 & 0x1f) & 1) != 0) {
        uVar10 = 0x7c000012;
LAB_009b004c:
        gen_mipsdsp_bitinsn((DisasContext_conflict6 *)env,uVar10,uVar13 & 0xfc0007ff,rd,op);
        return;
      }
    }
    break;
  case 0x7c000013:
    uVar10 = 0x7c000013;
    goto LAB_009afe00;
  case 0x7c000014:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar13 = uVar10 + 0x83ffffec >> 6;
    if (((uVar10 + 0x83ffffec) * 0x4000000 | uVar13) < 0x20) {
      if ((0xfdcff33U >> (uVar13 & 0x1f) & 1) != 0) {
        uVar11 = 0x7c000014;
        goto LAB_009b00ca;
      }
      if ((0xb00000c0U >> (uVar13 & 0x1f) & 1) != 0) {
        iVar12 = 1;
        uVar11 = 0x7c000014;
        goto LAB_009b00fa;
      }
    }
    break;
  case 0x7c000015:
    uVar10 = uVar13 & 0xfc0007ff;
    switch((uVar10 + 0x83ffffeb) * 0x4000000 | uVar10 + 0x83ffffeb >> 6) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
    case 0x10:
    case 0x11:
    case 0x12:
      iVar12 = 0;
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 0xb:
    case 0xe:
    case 0x13:
    case 0x18:
    case 0x19:
    case 0x1a:
      iVar12 = 1;
      break;
    default:
      goto switchD_009af7d4_caseD_7c00000b;
    case 0xc:
    case 0xd:
    case 0xf:
    case 0x14:
    case 0x15:
    case 0x1c:
      uVar11 = 0x7c000015;
      goto LAB_009b00ca;
    case 0x1e:
    case 0x1f:
      uVar11 = 0x7c000015;
      goto LAB_009b0283;
    }
    uVar10 = 0x7c000015;
    goto LAB_009b0077;
  case 0x7c000016:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar8 = uVar10 + 0x83ffffaa >> 6;
    if (((uVar10 + 0x83ffffaa) * 0x4000000 | uVar8) < 0x1f) {
      if ((0x78197979U >> (uVar8 & 0x1f) & 1) != 0) {
        uVar11 = 0x7c000016;
        goto LAB_009b00ca;
      }
      if ((0x60606U >> (uVar8 & 0x1f) & 1) != 0) {
        uVar10 = 0x7c000016;
        goto LAB_009b004c;
      }
    }
    break;
  case 0x7c000017:
    uVar10 = 0x7c000017;
LAB_009afe00:
    gen_mipsdsp_shift((DisasContext_conflict6 *)env,uVar10,rd,base,op);
    return;
  case 0x7c000018:
  case 0x7c000019:
  case 0x7c00001a:
  case 0x7c00001b:
  case 0x7c000022:
  case 0x7c000023:
    if (uVar8 == 0x7c000018 && (uVar1 >> 0x24 & 1) != 0) {
      uVar10 = uVar13 & 0x7c0007d8;
      uVar13 = uVar10 + 0x83ffffe8 >> 6;
      if (uVar13 < 0x18) {
        if ((0xf0f0fU >> (uVar13 & 0x1f) & 1) != 0) {
          uVar11 = 0x7c000018;
          goto LAB_009b00ca;
        }
        if ((0xc05000U >> (uVar13 & 0x1f) & 1) != 0) {
          iVar12 = 1;
          uVar11 = 0x7c000018;
          goto LAB_009b00fa;
        }
      }
    }
    else if ((uVar1 >> 0x30 & 1) != 0) goto LAB_009afa78;
    break;
  case 0x7c00001c:
  case 0x7c00001d:
  case 0x7c00001e:
  case 0x7c00001f:
  case 0x7c000026:
  case 0x7c000027:
    if ((uVar1 >> 0x30 & 1) == 0) {
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
LAB_009afa78:
    gen_loongson_integer((DisasContext_conflict6 *)env,uVar8,rd,base,op);
    return;
  case 0x7c000030:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar13 = uVar10 + 0x83ffffd0 >> 6;
    if ((((uVar10 + 0x83ffffd0) * 0x4000000 | uVar13) < 0x1c) &&
       ((0xf55bbffU >> (uVar13 & 0x1f) & 1) != 0)) {
      iVar12 = 0;
      uVar11 = 0x7c000030;
LAB_009b00fa:
      gen_mipsdsp_multiply((DisasContext_conflict6 *)env,uVar11,uVar10,rd,base,op,iVar12);
      return;
    }
    break;
  case 0x7c000031:
    ctx_00 = (DisasContext_conflict6 *)0x7c000031;
    goto LAB_009aff7d;
  case 0x7c000034:
    uVar10 = uVar13 & 0xfc0007ff;
    uVar13 = uVar10 + 0x83ffffcc >> 6;
    if ((((uVar10 + 0x83ffffcc) * 0x4000000 | uVar13) < 0x20) &&
       (((0xfaff0000U >> (uVar13 & 0x1f) & 1) != 0 || ((0xf8fbU >> (uVar13 & 0x1f) & 1) != 0)))) {
      iVar12 = 0;
      uVar11 = 0x7c000034;
      goto LAB_009b00fa;
    }
    break;
  case 0x7c000035:
    ctx_00 = (DisasContext_conflict6 *)0x7c000035;
LAB_009aff7d:
    gen_mipsdsp_append(env,ctx_00,op,base,rd,rd);
    return;
  case 0x7c000038:
    uVar8 = (uVar13 & 0xfc0007ff) + 0x83ffffc8;
    uVar2 = uVar8 >> 6;
    uVar8 = uVar8 * 0x4000000 | uVar2;
    if (uVar8 < 0x20) {
      if ((0xccffU >> (uVar2 & 0x1f) & 1) != 0) {
        uVar10 = 0x7c000038;
LAB_009aff67:
        iVar12 = 1;
        uVar6 = op;
        op = rd;
        goto LAB_009b0159;
      }
      if ((0x8c080000U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar8 != 0x12) break;
        iVar12 = 1;
      }
      else {
        iVar12 = 0;
      }
      uVar10 = 0x7c000038;
LAB_009b0159:
      gen_mipsdsp_accinsn((DisasContext_conflict6 *)env,uVar10,uVar13 & 0xfc0007ff,uVar6,base,op,
                          iVar12);
      return;
    }
    break;
  case 0x7c00003c:
    uVar8 = (uVar13 & 0xfc0007ff) + 0x83ffffc4;
    uVar2 = uVar8 >> 6;
    if ((uVar8 * 0x4000000 | uVar2) < 0x20) {
      if ((0xf3ccffU >> (uVar2 & 0x1f) & 1) != 0) {
        uVar10 = 0x7c00003c;
        goto LAB_009aff67;
      }
      if ((0x8c000000U >> (uVar2 & 0x1f) & 1) != 0) {
        iVar12 = 0;
        uVar10 = 0x7c00003c;
        goto LAB_009b0159;
      }
    }
  }
switchD_009af7d4_caseD_7c00000b:
  iVar12 = 0x14;
LAB_009b024c:
  generate_exception_err((DisasContext_conflict6 *)env,iVar12,0);
  return;
}

Assistant:

static void decode_opc_special3(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1, op2;
    int16_t imm;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;
    imm = sextract32(ctx->opcode, 7, 9);

    op1 = MASK_SPECIAL3(ctx->opcode);

    /*
     * EVA loads and stores overlap Loongson 2E instructions decoded by
     * decode_opc_special3_legacy(), so be careful to allow their decoding when
     * EVA is absent.
     */
    if (ctx->eva) {
        switch (op1) {
        case OPC_LWLE:
        case OPC_LWRE:
            check_insn_opc_removed(ctx, ISA_MIPS32R6);
            /* fall through */
        case OPC_LBUE:
        case OPC_LHUE:
        case OPC_LBE:
        case OPC_LHE:
        case OPC_LLE:
        case OPC_LWE:
            check_cp0_enabled(ctx);
            gen_ld(ctx, op1, rt, rs, imm);
            return;
        case OPC_SWLE:
        case OPC_SWRE:
            check_insn_opc_removed(ctx, ISA_MIPS32R6);
            /* fall through */
        case OPC_SBE:
        case OPC_SHE:
        case OPC_SWE:
            check_cp0_enabled(ctx);
            gen_st(ctx, op1, rt, rs, imm);
            return;
        case OPC_SCE:
            check_cp0_enabled(ctx);
            gen_st_cond(ctx, rt, rs, imm, MO_TESL, true);
            return;
        case OPC_CACHEE:
            check_cp0_enabled(ctx);
            if (ctx->hflags & MIPS_HFLAG_ITC_CACHE) {
                gen_cache_operation(ctx, rt, rs, imm);
            }
            /* Treat as NOP. */
            return;
        case OPC_PREFE:
            check_cp0_enabled(ctx);
            /* Treat as NOP. */
            return;
        }
    }

    switch (op1) {
    case OPC_EXT:
    case OPC_INS:
        check_insn(ctx, ISA_MIPS32R2);
        gen_bitops(ctx, op1, rt, rs, sa, rd);
        break;
    case OPC_BSHFL:
        op2 = MASK_BSHFL(ctx->opcode);
        switch (op2) {
        case OPC_ALIGN:
        case OPC_ALIGN_1:
        case OPC_ALIGN_2:
        case OPC_ALIGN_3:
        case OPC_BITSWAP:
            check_insn(ctx, ISA_MIPS32R6);
            decode_opc_special3_r6(env, ctx);
            break;
        default:
            check_insn(ctx, ISA_MIPS32R2);
            gen_bshfl(ctx, op2, rt, rd);
            break;
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DEXTM:
    case OPC_DEXTU:
    case OPC_DEXT:
    case OPC_DINSM:
    case OPC_DINSU:
    case OPC_DINS:
        check_insn(ctx, ISA_MIPS64R2);
        check_mips_64(ctx);
        gen_bitops(ctx, op1, rt, rs, sa, rd);
        break;
    case OPC_DBSHFL:
        op2 = MASK_DBSHFL(ctx->opcode);
        switch (op2) {
        case OPC_DALIGN:
        case OPC_DALIGN_1:
        case OPC_DALIGN_2:
        case OPC_DALIGN_3:
        case OPC_DALIGN_4:
        case OPC_DALIGN_5:
        case OPC_DALIGN_6:
        case OPC_DALIGN_7:
        case OPC_DBITSWAP:
            check_insn(ctx, ISA_MIPS32R6);
            decode_opc_special3_r6(env, ctx);
            break;
        default:
            check_insn(ctx, ISA_MIPS64R2);
            check_mips_64(ctx);
            op2 = MASK_DBSHFL(ctx->opcode);
            gen_bshfl(ctx, op2, rt, rd);
            break;
        }
        break;
#endif
    case OPC_RDHWR:
        gen_rdhwr(ctx, rt, rd, extract32(ctx->opcode, 6, 3));
        break;
    case OPC_FORK:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_load_gpr(tcg_ctx, t1, rs);
            gen_helper_fork(tcg_ctx, t0, t1);
            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
        }
        break;
    case OPC_YIELD:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rs);
            gen_helper_yield(tcg_ctx, t0, tcg_ctx->cpu_env, t0);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    default:
        if (ctx->insn_flags & ISA_MIPS32R6) {
            decode_opc_special3_r6(env, ctx);
        } else {
            decode_opc_special3_legacy(env, ctx);
        }
    }
}